

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_standard_logger__on_delete(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  fct_nlist__final((fct_nlist_t *)&logger_[1].vtable.on_test_suite_start,free);
  free(logger_);
  return;
}

Assistant:

static void
fct_standard_logger__on_delete(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_standard_logger_t *logger = (fct_standard_logger_t*)logger_;
    fct_unused(e);
    fct_nlist__final(&(logger->failed_cndtns_list), free);
    free(logger);
    logger_ =NULL;
}